

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O2

string * __thiscall
ser::OffsetTable::ToString_abi_cxx11_(string *__return_storage_ptr__,OffsetTable *this)

{
  pointer pmVar1;
  ulong uVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  ulong uVar5;
  int iVar6;
  double dVar7;
  string local_1c8;
  ostringstream ss;
  
  uVar2 = ((long)(this->savepoints_).
                 super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->savepoints_).
                super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x50;
  iVar6 = (int)uVar2;
  dVar7 = log10((double)iVar6);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::operator<<((ostream *)&ss,"OffsetTable {\n");
  dVar7 = ceil(dVar7);
  uVar5 = 0;
  uVar2 = uVar2 & 0xffffffff;
  if (iVar6 < 1) {
    uVar2 = uVar5;
  }
  for (; uVar5 != uVar2; uVar5 = uVar5 + 1) {
    poVar3 = std::operator<<((ostream *)&ss,"  ");
    *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = (long)(int)dVar7;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar5);
    poVar3 = std::operator<<(poVar3,": ");
    Savepoint::ToString_abi_cxx11_
              (&local_1c8,
               (this->savepoints_).
               super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
               super__Vector_impl_data._M_start + uVar5);
    poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
    std::operator<<(poVar3,"  ");
    std::__cxx11::string::~string((string *)&local_1c8);
    pmVar1 = (this->entries_).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::operator<<((ostream *)&ss,"( ");
    for (p_Var4 = *(_Base_ptr *)((long)&pmVar1[uVar5]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var4 != &pmVar1[uVar5]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      poVar3 = std::operator<<((ostream *)&ss,(string *)(p_Var4 + 1));
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::operator<<(poVar3," ");
    }
    std::operator<<((ostream *)&ss,")\n");
  }
  std::operator<<((ostream *)&ss,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string OffsetTable::ToString() const
{
    const int size = savepoints_.size();
    const int width = std::ceil(std::log10(static_cast<double>(size)));

    std::ostringstream ss;

    ss << "OffsetTable {\n";
    for (int i = 0; i < size; ++i)
    {
        // Print savepoint
        ss << "  " << std::setw(width) << i << ": " << savepoints_[i].ToString() << "  ";

        // Print offsets
        const OffsetTableEntry& entry = entries_[i];
        ss << "( ";
        for (const_iterator iter = entry.begin(); iter != entry.end(); ++iter)
            ss << iter->first << ":" << iter->second.offset << " ";
        ss << ")\n";
    }
    ss << "}\n";

    return ss.str();
}